

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O0

int Nwk_ObjFindFanout(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanout)

{
  bool bVar1;
  int local_2c;
  Nwk_Obj_t *pNStack_28;
  int i;
  Nwk_Obj_t *pTemp;
  Nwk_Obj_t *pFanout_local;
  Nwk_Obj_t *pObj_local;
  
  local_2c = 0;
  while( true ) {
    bVar1 = false;
    if (local_2c < pObj->nFanouts) {
      pNStack_28 = pObj->pFanio[pObj->nFanins + local_2c];
      bVar1 = pNStack_28 != (Nwk_Obj_t *)0x0;
    }
    if (!bVar1) break;
    if (pNStack_28 == pFanout) {
      return local_2c;
    }
    local_2c = local_2c + 1;
  }
  return -1;
}

Assistant:

int Nwk_ObjFindFanout( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanout )
{  
    Nwk_Obj_t * pTemp;
    int i;
    Nwk_ObjForEachFanout( pObj, pTemp, i )
        if ( pTemp == pFanout )
            return i;
    return -1;
}